

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  undefined4 *puVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  long lVar4;
  void *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  long *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&this->params[0].type + lVar4) = 0;
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    local_68 = (void *)0x0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = (long *)0x0;
    uStack_40 = 0;
    if ((void **)((long)&this->params[0].v.data + lVar4) != &local_68) {
      piVar2 = *(int **)((long)&this->params[0].v.refcount + lVar4);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          __ptr = *(void **)((long)&this->params[0].v.data + lVar4);
          plVar3 = *(long **)((long)&this->params[0].v.allocator + lVar4);
          if (plVar3 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(void **)((long)&this->params[0].v.data + lVar4) = local_68;
      piVar2 = (int *)CONCAT44(uStack_5c,uStack_60);
      *(int **)((long)&this->params[0].v.refcount + lVar4) = piVar2;
      *(ulong *)((long)&this->params[0].v.elemsize + lVar4) = CONCAT44(uStack_54,uStack_58);
      *(undefined4 *)((long)&this->params[0].v.elempack + lVar4) = uStack_50;
      *(long **)((long)&this->params[0].v.allocator + lVar4) = local_48;
      puVar1 = (undefined4 *)((long)&this->params[0].v.dims + lVar4);
      *puVar1 = (undefined4)uStack_40;
      puVar1[1] = uStack_40._4_4_;
      puVar1[2] = (undefined4)local_38;
      puVar1[3] = local_38._4_4_;
      *(undefined8 *)((long)&this->params[0].v.cstep + lVar4) = uStack_30;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_48 == (long *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (**(code **)(*local_48 + 0x18))();
          }
        }
      }
    }
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x900);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].type = 0;
        params[i].v = Mat();
    }
}